

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

InterfaceType libcellml::interfaceTypeFor(PublicPrivateRequiredPair *pair)

{
  InterfaceType IVar1;
  
  IVar1 = pair->second & PRIVATE | PUBLIC;
  if (pair->first == false) {
    IVar1 = (InterfaceType)pair->second;
  }
  return IVar1;
}

Assistant:

Variable::InterfaceType interfaceTypeFor(const PublicPrivateRequiredPair &pair)
{
    Variable::InterfaceType interfaceType = Variable::InterfaceType::NONE;
    if (pair.first && pair.second) {
        interfaceType = Variable::InterfaceType::PUBLIC_AND_PRIVATE;
    } else if (pair.first) {
        interfaceType = Variable::InterfaceType::PUBLIC;
    } else if (pair.second) {
        interfaceType = Variable::InterfaceType::PRIVATE;
    }

    return interfaceType;
}